

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::XmlReporter(XmlReporter *this,ReporterConfig *_config)

{
  XmlWriter *in_RSI;
  undefined8 *in_RDI;
  ReporterConfig *in_stack_00000098;
  StreamingReporterBase<Catch::XmlReporter> *in_stack_000000a0;
  ostream *in_stack_ffffffffffffffe8;
  
  StreamingReporterBase<Catch::XmlReporter>::StreamingReporterBase
            (in_stack_000000a0,in_stack_00000098);
  *in_RDI = &PTR__XmlReporter_0048e7c0;
  Timer::Timer((Timer *)(in_RDI + 0x2d));
  ReporterConfig::stream((ReporterConfig *)in_RSI);
  XmlWriter::XmlWriter(in_RSI,in_stack_ffffffffffffffe8);
  *(undefined4 *)(in_RDI + 0x37) = 0;
  *(undefined1 *)(in_RDI + 0x2c) = 1;
  *(undefined1 *)((long)in_RDI + 0x161) = 1;
  return;
}

Assistant:

XmlReporter::XmlReporter( ReporterConfig const& _config )
    :   StreamingReporterBase( _config ),
        m_xml(_config.stream())
    {
        m_reporterPrefs.shouldRedirectStdOut = true;
        m_reporterPrefs.shouldReportAllAssertions = true;
    }